

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argumentUtils.cpp
# Opt level: O2

QFunctionJAOHInterface *
ArgumentUtils::GetQheuristicFromArgs(PlanningUnitDecPOMDPDiscrete *pu,Arguments *args)

{
  QMDP *this;
  AlphaVectorPlanning *pAVar1;
  QBGPlanner_TreeIncPruneBnB *this_00;
  QFunctionJAOHInterface *this_01;
  TreeIncPruneBGPlanner *this_02;
  ostream *poVar2;
  E *this_03;
  long lVar3;
  Arguments args1;
  
  switch(args->qheur) {
  case eQMDP:
  case eQheurUndefined:
    this = (QMDP *)operator_new(0x70);
    lVar3 = -0x98;
    QMDP::QMDP(this,pu,false);
    break;
  case eQPOMDP:
    this_01 = (QFunctionJAOHInterface *)operator_new(0x60);
    QPOMDP::QPOMDP((QPOMDP *)this_01,pu);
    goto LAB_00405f69;
  case eQBG:
    this_01 = (QFunctionJAOHInterface *)operator_new(0x60);
    QBG::QBG((QBG *)this_01,pu);
    goto LAB_00405f69;
  case eQMDPc:
    this = (QMDP *)operator_new(0x70);
    lVar3 = -0x98;
    QMDP::QMDP(this,pu,true);
    break;
  case eQPOMDPav:
    pAVar1 = (AlphaVectorPlanning *)operator_new(400);
    MonahanPOMDPPlanner::MonahanPOMDPPlanner((MonahanPOMDPPlanner *)pAVar1,pu,true);
    AlphaVectorPlanning::SetAcceleratedPruningThreshold(pAVar1,args->acceleratedPruningThreshold);
    this = (QMDP *)operator_new(0x38);
    lVar3 = -0x90;
    QAV<MonahanPOMDPPlanner>::QAV((QAV<MonahanPOMDPPlanner> *)this,pu,(MonahanPOMDPPlanner *)pAVar1)
    ;
    break;
  case eQBGav:
    pAVar1 = (AlphaVectorPlanning *)operator_new(400);
    MonahanBGPlanner::MonahanBGPlanner((MonahanBGPlanner *)pAVar1,pu,true);
    AlphaVectorPlanning::SetAcceleratedPruningThreshold(pAVar1,args->acceleratedPruningThreshold);
    this = (QMDP *)operator_new(0x38);
    lVar3 = -0x90;
    QAV<MonahanBGPlanner>::QAV((QAV<MonahanBGPlanner> *)this,pu,(MonahanBGPlanner *)pAVar1);
    break;
  case eQHybrid:
    this_01 = GetHybridQheuristicFromArgs(pu,args);
    goto LAB_00405f64;
  case eQPOMDPhybrid:
    ArgumentHandlers::Arguments::Arguments(&args1,args);
    args1.QHybridFirstTS = eQPOMDP;
    args1.QHybridLastTS = eQPOMDP;
    this_01 = GetHybridQheuristicFromArgs(pu,&args1);
    goto LAB_00405f54;
  case eQBGhybrid:
    ArgumentHandlers::Arguments::Arguments(&args1,args);
    args1.QHybridFirstTS = eQBG;
    args1.QHybridLastTS = eQBG;
    this_01 = GetHybridQheuristicFromArgs(pu,&args1);
LAB_00405f54:
    std::__cxx11::string::~string((string *)&args1.maxplus_updateT);
LAB_00405f64:
    if (this_01 == (QFunctionJAOHInterface *)0x0) {
switchD_00405d20_default:
      this_03 = (E *)__cxa_allocate_exception(0x28);
      E::E(this_03,"argumentUtils::GetQheuristicFromArgs() no Q heuristic instantiated");
      __cxa_throw(this_03,&E::typeinfo,E::~E);
    }
    goto LAB_00405f69;
  case eQBGTreeIncPrune:
    this_02 = (TreeIncPruneBGPlanner *)operator_new(0x290);
    TreeIncPruneBGPlanner::TreeIncPruneBGPlanner(this_02,pu);
    this_02->_m_pruneAfterUnion = args->TreeIPpruneAfterUnion;
    this_02->_m_pruneAfterCrossSum = args->TreeIPpruneAfterCrossSum;
    this_02->_m_useVectorCache = args->TreeIPuseVectorCache;
    this = (QMDP *)operator_new(0x38);
    lVar3 = -0x90;
    QAV<TreeIncPruneBGPlanner>::QAV((QAV<TreeIncPruneBGPlanner> *)this,pu,this_02);
    break;
  case eQBGTreeIncPruneBnB:
    this_00 = (QBGPlanner_TreeIncPruneBnB *)operator_new(0x248);
    QBGPlanner_TreeIncPruneBnB::QBGPlanner_TreeIncPruneBnB(this_00,pu);
    this = (QMDP *)operator_new(0x38);
    lVar3 = -0x90;
    QAV<QBGPlanner_TreeIncPruneBnB>::QAV((QAV<QBGPlanner_TreeIncPruneBnB> *)this,pu,this_00);
    break;
  default:
    goto switchD_00405d20_default;
  }
  this_01 = (QFunctionJAOHInterface *)((long)&this->field_0x0 + *(long *)(*(long *)this + lVar3));
LAB_00405f69:
  if (0 < args->verbose) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Instantiated ");
    (**(code **)(*(long *)((long)&this_01->field_0x0 + *(long *)((long)*this_01 + -0x60)) + 0x48))
              (&args1,(long)&this_01->field_0x0 + *(long *)((long)*this_01 + -0x60));
    poVar2 = std::operator<<(poVar2,(string *)&args1);
    poVar2 = std::operator<<(poVar2," heuristic.");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&args1);
  }
  return this_01;
}

Assistant:

QFunctionJAOHInterface* GetQheuristicFromArgs(
    const PlanningUnitDecPOMDPDiscrete* pu,
    const ArgumentHandlers::Arguments &args)
{
    QFunctionJAOHInterface* q=0;
#if 0
    QAVParameters qavParams;
    bool useAV=false;
#endif
    switch(args.qheur)
    {
    case eQMDP:
    case eQheurUndefined: // if undefined,we default to QMDP
        q = new QMDP(pu,false);
        break;
    case eQPOMDP:
        q = new QPOMDP(pu);
        break;
    case eQBG:
        q = new QBG(pu);
        break;
    case eQMDPc:
        q = new QMDP(pu,true);
        break;
    case eQPOMDPav:
    {
        //true means 'use incremental pruning'
        MonahanPOMDPPlanner *M=new MonahanPOMDPPlanner(pu,true);
        M->SetAcceleratedPruningThreshold(args.acceleratedPruningThreshold);
        q = new QAV<MonahanPOMDPPlanner>(pu,M);

        break;
    }
    case eQBGav:
    {
        //true means 'use incremental pruning'
        MonahanBGPlanner *M=new MonahanBGPlanner(pu,true);
        M->SetAcceleratedPruningThreshold(args.acceleratedPruningThreshold);
        q = new QAV<MonahanBGPlanner>(pu,M);

        break;
    }
    case eQHybrid:
        q = GetHybridQheuristicFromArgs(pu,args);
        break;
    case eQPOMDPhybrid:
    {
        ArgumentHandlers::Arguments args1=args;
        args1.QHybridFirstTS=eQPOMDP;
        args1.QHybridLastTS=eQPOMDP;
#if 0 // don't override this any more
        args1.QHybridHorizonLastTimeSteps=0;
#endif
        q = GetHybridQheuristicFromArgs(pu,args1);
        break;
    }
    case eQBGhybrid:
    {
        ArgumentHandlers::Arguments args1=args;
        args1.QHybridFirstTS=eQBG;
        args1.QHybridLastTS=eQBG;
#if 0 // don't override this any more
        args1.QHybridHorizonLastTimeSteps=0;
#endif
        q=GetHybridQheuristicFromArgs(pu,args1);
        break;
    }
    case eQBGTreeIncPrune:
    {
        TreeIncPruneBGPlanner *M=new TreeIncPruneBGPlanner(pu);
        if(args.TreeIPpruneAfterUnion)
            M->SetPruneAfterUnion(true);
        else
            M->SetPruneAfterUnion(false);
        if(args.TreeIPpruneAfterCrossSum)
            M->SetPruneAfterCrossSum(true);
        else
            M->SetPruneAfterCrossSum(false);
        if(args.TreeIPuseVectorCache)
            M->SetUseVectorCache(true);
        else
            M->SetUseVectorCache(false);
            
        q = new QAV<TreeIncPruneBGPlanner>(pu,M);

        break;
    }
    case eQBGTreeIncPruneBnB:
    {
        QBGPlanner_TreeIncPruneBnB *M=new QBGPlanner_TreeIncPruneBnB(pu);
        q = new QAV<QBGPlanner_TreeIncPruneBnB>(pu,M);
        break;
    }
    }
    if(q==0)
        throw(E("argumentUtils::GetQheuristicFromArgs() no Q heuristic instantiated"));

    if(args.verbose>0)
        cout << "Instantiated " << q->SoftPrintBrief() << " heuristic." << endl;
    
    return(q);
}